

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testChannels.cpp
# Opt level: O0

void anon_unknown.dwarf_43a58::writeRead
               (Array2D<Imath_3_2::half> *h1out,Array2D<Imath_3_2::half> *h2out,char *fileName,
               int width,int height)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  half *phVar4;
  ostream *poVar5;
  float *pfVar6;
  Vec2<float> *this;
  Vec2<float> *v;
  int *piVar7;
  char *__s2;
  Channel *pCVar8;
  int in_ECX;
  char *in_RDX;
  Array2D<Imath_3_2::half> *in_RSI;
  Array2D<Imath_3_2::half> *in_RDI;
  int in_R8D;
  float fVar9;
  float fVar10;
  int x;
  int y;
  ConstIterator ii;
  ConstIterator hi;
  FrameBuffer fb_1;
  Array2D<Imath_3_2::half> h4in;
  Array2D<Imath_3_2::half> h3in;
  Array2D<Imath_3_2::half> h1in;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  InputFile in;
  OutputFile out;
  FrameBuffer fb;
  Header hdr;
  undefined4 in_stack_fffffffffffffafc;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffb04;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffffb0c;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffb10;
  int local_2d0;
  int local_2cc;
  Slice local_298 [56];
  Slice local_260 [56];
  Slice local_228 [56];
  char local_1f0 [48];
  Array2D<Imath_3_2::half> local_1c0;
  Array2D<Imath_3_2::half> local_1a8;
  Array2D<Imath_3_2::half> local_190;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int *local_168;
  undefined1 local_160 [16];
  undefined1 local_150 [72];
  Slice local_108 [56];
  char local_d0 [52];
  Channel local_9c [16];
  Channel local_8c [16];
  Channel local_7c [28];
  Vec2<float> local_60;
  Header local_58 [60];
  int local_1c;
  char *local_18;
  Array2D<Imath_3_2::half> *local_10;
  Array2D<Imath_3_2::half> *local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_2::Header::Header
            (local_58,in_ECX,in_R8D,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_7c,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)"H1");
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_8c,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)"H2");
  pcVar3 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel(local_9c,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar3,(Channel *)"H3");
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x146be1);
  phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_8,0);
  Imf_3_2::Slice::Slice(local_108,HALF,(char *)phVar4,2,(long)local_1c * 2,1,1,0.0,false,false);
  Imf_3_2::FrameBuffer::insert(local_d0,(Slice *)"H1");
  phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_10,0);
  uVar12 = 0;
  uVar11 = 0;
  Imf_3_2::Slice::Slice
            ((Slice *)(local_150 + 0x10),HALF,(char *)phVar4,2,(long)local_1c * 2,1,1,0.0,false,
             false);
  Imf_3_2::FrameBuffer::insert(local_d0,(Slice *)"H2");
  poVar5 = std::operator<<((ostream *)&std::cout,"writing");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  remove(local_18);
  pcVar3 = local_18;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::OutputFile::OutputFile((OutputFile *)local_150,pcVar3,local_58,iVar2);
  Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)local_150);
  Imf_3_2::OutputFile::writePixels((int)local_150);
  Imf_3_2::OutputFile::~OutputFile((OutputFile *)local_150);
  Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x146db2);
  poVar5 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  pcVar3 = local_18;
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile((InputFile *)local_160,pcVar3,iVar2);
  Imf_3_2::InputFile::header();
  local_168 = (int *)Imf_3_2::Header::dataWindow();
  local_16c = (local_168[2] - *local_168) + 1;
  local_170 = (local_168[3] - local_168[1]) + 1;
  local_174 = *local_168;
  local_178 = local_168[1];
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffb10,CONCAT44(in_stack_fffffffffffffb0c,uVar12),
             CONCAT44(in_stack_fffffffffffffb04,uVar11));
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffb10,CONCAT44(in_stack_fffffffffffffb0c,uVar12),
             CONCAT44(in_stack_fffffffffffffb04,uVar11));
  Imf_3_2::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffb10,CONCAT44(in_stack_fffffffffffffb0c,uVar12),
             CONCAT44(in_stack_fffffffffffffb04,uVar11));
  Imf_3_2::FrameBuffer::FrameBuffer((FrameBuffer *)0x146f1d);
  phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_190,(long)-local_178);
  Imf_3_2::Slice::Slice
            (local_228,HALF,(char *)(phVar4 + -local_174),2,(long)local_16c * 2,1,1,3.0,false,false)
  ;
  Imf_3_2::FrameBuffer::insert(local_1f0,(Slice *)"H1");
  phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_1a8,(long)-local_178);
  Imf_3_2::Slice::Slice
            (local_260,HALF,(char *)(phVar4 + -local_174),2,(long)local_16c * 2,1,1,3.0,false,false)
  ;
  Imf_3_2::FrameBuffer::insert(local_1f0,(Slice *)"H3");
  phVar4 = Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_1c0,(long)-local_178);
  uVar13 = 0;
  uVar12 = 0;
  uVar11 = 1;
  Imf_3_2::Slice::Slice
            (local_298,HALF,(char *)(phVar4 + -local_174),2,(long)local_16c * 2,1,1,3.0,false,false)
  ;
  Imf_3_2::FrameBuffer::insert(local_1f0,(Slice *)"H4");
  Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)local_160);
  Imf_3_2::InputFile::readPixels((int)local_160,local_168[1]);
  poVar5 = std::operator<<((ostream *)&std::cout," comparing");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::displayWindow();
  Imf_3_2::Header::displayWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb10,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffb0c,uVar13));
  if (!bVar1) {
    __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                  ,0xb5,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  Imf_3_2::InputFile::header();
  Imf_3_2::Header::dataWindow();
  Imf_3_2::Header::dataWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffb10,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffb0c,uVar13));
  if (!bVar1) {
    __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                  ,0xb6,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  Imf_3_2::InputFile::header();
  pfVar6 = (float *)Imf_3_2::Header::pixelAspectRatio();
  fVar9 = *pfVar6;
  pfVar6 = (float *)Imf_3_2::Header::pixelAspectRatio();
  if ((fVar9 != *pfVar6) || (NAN(fVar9) || NAN(*pfVar6))) {
    __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                  ,0xb7,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  Imf_3_2::InputFile::header();
  this = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_2::Header::screenWindowCenter();
  bVar1 = Imath_3_2::Vec2<float>::operator==(this,v);
  if (!bVar1) {
    __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                  ,0xb9,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  Imf_3_2::InputFile::header();
  pfVar6 = (float *)Imf_3_2::Header::screenWindowWidth();
  fVar9 = *pfVar6;
  pfVar6 = (float *)Imf_3_2::Header::screenWindowWidth();
  if ((fVar9 == *pfVar6) && (!NAN(fVar9) && !NAN(*pfVar6))) {
    Imf_3_2::InputFile::header();
    piVar7 = (int *)Imf_3_2::Header::lineOrder();
    iVar2 = *piVar7;
    piVar7 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar2 != *piVar7) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                    ,0xbb,
                    "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                   );
    }
    Imf_3_2::InputFile::header();
    piVar7 = (int *)Imf_3_2::Header::compression();
    iVar2 = *piVar7;
    piVar7 = (int *)Imf_3_2::Header::compression();
    if (iVar2 != *piVar7) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                    ,0xbc,
                    "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                   );
    }
    Imf_3_2::Header::channels();
    Imf_3_2::ChannelList::begin();
    Imf_3_2::ChannelList::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb04,uVar12),
               (Iterator *)CONCAT44(in_stack_fffffffffffffafc,uVar11));
    Imf_3_2::InputFile::header();
    Imf_3_2::Header::channels();
    Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      Imf_3_2::ChannelList::end();
      Imf_3_2::ChannelList::ConstIterator::ConstIterator
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb04,uVar12),
                 (Iterator *)CONCAT44(in_stack_fffffffffffffafc,uVar11));
      bVar1 = Imf_3_2::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffb04,uVar12),
                                  (ConstIterator *)CONCAT44(in_stack_fffffffffffffafc,uVar11));
      if (!bVar1) {
        Imf_3_2::InputFile::header();
        Imf_3_2::Header::channels();
        Imf_3_2::ChannelList::end();
        bVar1 = Imf_3_2::operator==((ConstIterator *)CONCAT44(in_stack_fffffffffffffb04,uVar12),
                                    (ConstIterator *)CONCAT44(in_stack_fffffffffffffafc,uVar11));
        if (!bVar1) {
          __assert_fail("ii == in.header ().channels ().end ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                        ,0xcc,
                        "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                       );
        }
        local_2cc = 0;
        do {
          if (local_170 <= local_2cc) {
            Imf_3_2::FrameBuffer::~FrameBuffer((FrameBuffer *)0x147b19);
            Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffb04,uVar12));
            Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffb04,uVar12));
            Imf_3_2::Array2D<Imath_3_2::half>::~Array2D
                      ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffb04,uVar12));
            Imf_3_2::InputFile::~InputFile((InputFile *)local_160);
            remove(local_18);
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
            Imf_3_2::Header::~Header(local_58);
            return;
          }
          for (local_2d0 = 0; local_2d0 < local_16c; local_2d0 = local_2d0 + 1) {
            Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_190,(long)local_2cc);
            fVar9 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT44(in_stack_fffffffffffffb04,uVar12));
            Imf_3_2::Array2D<Imath_3_2::half>::operator[](local_8,(long)local_2cc);
            fVar10 = Imath_3_2::half::operator_cast_to_float
                               ((half *)CONCAT44(in_stack_fffffffffffffb04,uVar12));
            if ((fVar9 != fVar10) || (NAN(fVar9) || NAN(fVar10))) {
              __assert_fail("h1in[y][x] == h1out[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                            ,0xd2,
                            "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                           );
            }
            Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_1a8,(long)local_2cc);
            fVar9 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT44(in_stack_fffffffffffffb04,uVar12));
            if ((fVar9 != 0.0) || (NAN(fVar9))) {
              __assert_fail("h3in[y][x] == 0.0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                            ,0xd3,
                            "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                           );
            }
            Imf_3_2::Array2D<Imath_3_2::half>::operator[](&local_1c0,(long)local_2cc);
            fVar9 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT44(in_stack_fffffffffffffb04,uVar12));
            if ((fVar9 != 3.0) || (NAN(fVar9))) {
              __assert_fail("h4in[y][x] == 3.0",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                            ,0xd4,
                            "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                           );
            }
          }
          local_2cc = local_2cc + 1;
        } while( true );
      }
      pcVar3 = Imf_3_2::ChannelList::ConstIterator::name((ConstIterator *)0x147708);
      __s2 = Imf_3_2::ChannelList::ConstIterator::name((ConstIterator *)0x14771f);
      iVar2 = strcmp(pcVar3,__s2);
      if (iVar2 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                      ,0xc3,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                     );
      }
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x14777a);
      iVar2 = *(int *)pCVar8;
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1477a2);
      if (iVar2 != *(int *)pCVar8) {
        __assert_fail("hi.channel ().type == ii.channel ().type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                      ,0xc4,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                     );
      }
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x1477ed);
      iVar2 = *(int *)(pCVar8 + 4);
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x14780d);
      if (iVar2 != *(int *)(pCVar8 + 4)) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                      ,0xc5,
                      "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                     );
      }
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x147850);
      iVar2 = *(int *)(pCVar8 + 8);
      pCVar8 = Imf_3_2::ChannelList::ConstIterator::channel((ConstIterator *)0x147870);
      if (iVar2 != *(int *)(pCVar8 + 8)) break;
      Imf_3_2::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb04,uVar12));
      Imf_3_2::ChannelList::ConstIterator::operator++
                ((ConstIterator *)CONCAT44(in_stack_fffffffffffffb04,uVar12));
    }
    __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                  ,0xc6,
                  "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
                 );
  }
  __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testChannels.cpp"
                ,0xba,
                "void (anonymous namespace)::writeRead(const Array2D<half> &, const Array2D<half> &, const char *, int, int)"
               );
}

Assistant:

void
writeRead (
    const Array2D<half>& h1out,
    const Array2D<half>& h2out,
    const char           fileName[],
    int                  width,
    int                  height)
{
    //
    // Write an image file with three channels, H1, H2 and H3.
    // Our frame buffer contains pixel data only for H1 and H2;
    // the file's H3 channel should be filled with zeroes.
    //

    Header hdr (width, height);

    hdr.channels ().insert (
        "H1", // name
        Channel (
            HALF, // type
            1,    // xSampling
            1)    // ySampling
    );

    hdr.channels ().insert (
        "H2", // name
        Channel (
            HALF, // type
            1,    // xSampling
            1)    // ySampling
    );

    hdr.channels ().insert (
        "H3", // name
        Channel (
            HALF, // type
            1,    // xSampling
            1)    // ySampling
    );

    {
        FrameBuffer fb;

        fb.insert (
            "H1", // name
            Slice (
                HALF,                         // type
                (char*) &h1out[0][0],         // base
                sizeof (h1out[0][0]),         // xStride
                sizeof (h1out[0][0]) * width, // yStride
                1,                            // xSampling
                1)                            // ySampling
        );

        fb.insert (
            "H2", // name
            Slice (
                HALF,                         // type
                (char*) &h2out[0][0],         // base
                sizeof (h2out[0][0]),         // xStride
                sizeof (h2out[0][0]) * width, // yStride
                1,                            // xSampling
                1)                            // ySampling
        );

        cout << "writing" << flush;

        remove (fileName);
        OutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        out.writePixels (height);
    }

    //
    // Read the image back from the file.  Our frame buffer now
    // contains space for the three channels, H1, H3 and H4.
    // H1 and H3 should be read back from the file (but H3
    // should contain only zeroes), and H4 should be filled
    // with a default value, 3.0, because the file contains
    // no data for it.  The file's H2 channel should be ignored.
    //

    {
        cout << " reading" << flush;

        InputFile in (fileName);

        const Box2i& dw = in.header ().dataWindow ();
        int          w  = dw.max.x - dw.min.x + 1;
        int          h  = dw.max.y - dw.min.y + 1;
        int          dx = dw.min.x;
        int          dy = dw.min.y;

        Array2D<half> h1in (h, w);
        Array2D<half> h3in (h, w);
        Array2D<half> h4in (h, w);

        FrameBuffer fb;

        fb.insert (
            "H1", // name
            Slice (
                HALF,                    // type
                (char*) &h1in[-dy][-dx], // base
                sizeof (h1in[0][0]),     // xStride
                sizeof (h1in[0][0]) * w, // yStride
                1,                       // xSampling
                1,                       // ySampling
                3.0)                     // fillValue
        );

        fb.insert (
            "H3", // name
            Slice (
                HALF,                    // type
                (char*) &h3in[-dy][-dx], // base
                sizeof (h3in[0][0]),     // xStride
                sizeof (h3in[0][0]) * w, // yStride
                1,                       // xSampling
                1,                       // ySampling
                3.0)                     // fillValue
        );

        fb.insert (
            "H4", // name
            Slice (
                HALF,                    // type
                (char*) &h4in[-dy][-dx], // base
                sizeof (h4in[0][0]),     // xStride
                sizeof (h4in[0][0]) * w, // yStride
                1,                       // xSampling
                1,                       // ySampling
                3.0)                     // fillValue
        );

        in.setFrameBuffer (fb);
        in.readPixels (dw.min.y, dw.max.y);

        cout << " comparing" << flush;

        assert (in.header ().displayWindow () == hdr.displayWindow ());
        assert (in.header ().dataWindow () == hdr.dataWindow ());
        assert (in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ());
        assert (
            in.header ().screenWindowCenter () == hdr.screenWindowCenter ());
        assert (in.header ().screenWindowWidth () == hdr.screenWindowWidth ());
        assert (in.header ().lineOrder () == hdr.lineOrder ());
        assert (in.header ().compression () == hdr.compression ());

        ChannelList::ConstIterator hi = hdr.channels ().begin ();
        ChannelList::ConstIterator ii = in.header ().channels ().begin ();

        while (hi != hdr.channels ().end ())
        {
            assert (!strcmp (hi.name (), ii.name ()));
            assert (hi.channel ().type == ii.channel ().type);
            assert (hi.channel ().xSampling == ii.channel ().xSampling);
            assert (hi.channel ().ySampling == ii.channel ().ySampling);

            ++hi;
            ++ii;
        }

        assert (ii == in.header ().channels ().end ());

        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                assert (h1in[y][x] == h1out[y][x]);
                assert (h3in[y][x] == 0.0);
                assert (h4in[y][x] == 3.0);
            }
        }
    }

    remove (fileName);
    cout << endl;
}